

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

void Llb_ManFlowCollectAndMarkCone(Aig_Man_t *p,Vec_Ptr_t *vStarts,Vec_Ptr_t *vCone)

{
  long lVar1;
  
  vCone->nSize = 0;
  if (0 < vStarts->nSize) {
    lVar1 = 0;
    do {
      if ((*(uint *)&((Aig_Obj_t *)vStarts->pArray[lVar1])->field_0x18 & 0x30) != 0x10) {
        __assert_fail("pObj->fMarkA && !pObj->fMarkB",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                      ,0x420,
                      "void Llb_ManFlowCollectAndMarkCone(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
      }
      Llb_ManFlowCollectAndMarkCone_rec(p,(Aig_Obj_t *)vStarts->pArray[lVar1],vCone);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vStarts->nSize);
  }
  return;
}

Assistant:

void Llb_ManFlowCollectAndMarkCone( Aig_Man_t * p, Vec_Ptr_t * vStarts, Vec_Ptr_t * vCone )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrClear( vCone );
    Vec_PtrForEachEntry( Aig_Obj_t *, vStarts, pObj, i )
    {
        assert( pObj->fMarkA && !pObj->fMarkB );
        Llb_ManFlowCollectAndMarkCone_rec( p, pObj, vCone );
    }
}